

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplesort.hpp
# Opt level: O3

vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> * __thiscall
mxx::impl::
sample_arbit_decomp<__gnu_cxx::__normal_iterator<TwoBSA<unsigned_long>*,std::vector<TwoBSA<unsigned_long>,std::allocator<TwoBSA<unsigned_long>>>>,std::less<TwoBSA<unsigned_long>>>
          (vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
           *__return_storage_ptr__,impl *this,long begin,int param_4,long param_5,undefined8 param_6
          )

{
  impl *piVar1;
  undefined8 *puVar2;
  int iVar3;
  undefined8 uVar4;
  _func_int *p_Var5;
  pointer pTVar6;
  ulong uVar7;
  _func_int **pp_Var8;
  long lVar9;
  pointer pTVar10;
  long lVar11;
  pointer pTVar12;
  comm *pcVar13;
  comm *comm;
  size_type __new_size;
  long lVar14;
  size_t local_size;
  vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> all_samples;
  ulong local_88;
  undefined8 local_80;
  ulong local_78;
  custom_op<unsigned_long,_true> local_70;
  
  local_88 = (begin - (long)this >> 3) * -0x5555555555555555;
  local_80 = param_6;
  custom_op<unsigned_long,true>::custom_op<std::plus<unsigned_long>>
            ((custom_op<unsigned_long,true> *)&local_70);
  comm = *(comm **)(param_5 + 8);
  MPI_Allreduce(&local_88,&local_78,1,local_70.m_type_copy);
  custom_op<unsigned_long,_true>::~custom_op(&local_70);
  iVar3 = *(int *)(param_5 + 0x10);
  lVar14 = (long)iVar3;
  lVar9 = (long)param_4;
  uVar7 = (local_88 * lVar9 * lVar14 + local_78) - 1;
  __new_size = 1;
  if (local_78 <= uVar7) {
    __new_size = uVar7 / local_78;
  }
  (__return_storage_ptr__->
  super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::resize
            (__return_storage_ptr__,__new_size);
  pTVar10 = (__return_storage_ptr__->
            super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>).
            _M_impl.super__Vector_impl_data._M_start;
  pTVar6 = (__return_storage_ptr__->
           super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (pTVar6 != pTVar10) {
    lVar11 = 0;
    pcVar13 = (comm *)0x0;
    do {
      piVar1 = this + ((local_88 / (__new_size + 1) - 1) +
                      (ulong)(pcVar13 < (comm *)(local_88 % (__new_size + 1)))) * 0x18;
      this = piVar1 + 0x18;
      *(undefined8 *)((long)&pTVar10->SA + lVar11) = *(undefined8 *)(piVar1 + 0x10);
      uVar4 = *(undefined8 *)(piVar1 + 8);
      puVar2 = (undefined8 *)((long)&pTVar10->B1 + lVar11);
      *puVar2 = *(undefined8 *)piVar1;
      puVar2[1] = uVar4;
      pcVar13 = (comm *)((long)&pcVar13->_vptr_comm + 1);
      pTVar10 = (__return_storage_ptr__->
                super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>).
                _M_impl.super__Vector_impl_data._M_start;
      pTVar6 = (__return_storage_ptr__->
               super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      comm = (comm *)(((long)pTVar6 - (long)pTVar10 >> 3) * -0x5555555555555555);
      lVar11 = lVar11 + 0x18;
    } while (pcVar13 < comm);
  }
  gatherv<TwoBSA<unsigned_long>>
            ((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)&local_70,
             (mxx *)pTVar10,
             (TwoBSA<unsigned_long> *)(((long)pTVar6 - (long)pTVar10 >> 3) * -0x5555555555555555),0,
             (int)param_5,comm);
  pp_Var8 = local_70._vptr_custom_op;
  if (*(int *)(param_5 + 0x14) == 0) {
    if (local_70._vptr_custom_op !=
        (_func_int **)local_70.m_user_func.super__Function_base._M_functor._M_unused._0_8_) {
      uVar7 = ((long)local_70.m_user_func.super__Function_base._M_functor._M_unused._0_8_ -
               (long)local_70._vptr_custom_op >> 3) * -0x5555555555555555;
      lVar11 = 0x3f;
      if (uVar7 != 0) {
        for (; uVar7 >> lVar11 == 0; lVar11 = lVar11 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<TwoBSA<unsigned_long>*,std::vector<TwoBSA<unsigned_long>,std::allocator<TwoBSA<unsigned_long>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<std::less<TwoBSA<unsigned_long>>>>
                (local_70._vptr_custom_op,
                 local_70.m_user_func.super__Function_base._M_functor._M_unused._M_object,
                 ((uint)lVar11 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<TwoBSA<unsigned_long>*,std::vector<TwoBSA<unsigned_long>,std::allocator<TwoBSA<unsigned_long>>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::less<TwoBSA<unsigned_long>>>>
                (pp_Var8,local_70.m_user_func.super__Function_base._M_functor._M_unused._M_object);
    }
    pTVar10 = (__return_storage_ptr__->
              super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>).
              _M_impl.super__Vector_impl_data._M_start;
    pTVar6 = (__return_storage_ptr__->
             super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    if (((long)pTVar6 - (long)pTVar10 >> 3) * -0x5555555555555555 - (lVar14 + -1) != 0) {
      std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::resize
                (__return_storage_ptr__,lVar14 - 1);
      pTVar10 = (__return_storage_ptr__->
                super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>).
                _M_impl.super__Vector_impl_data._M_start;
      pTVar6 = (__return_storage_ptr__->
               super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>).
               _M_impl.super__Vector_impl_data._M_finish;
    }
    pTVar12 = pTVar10;
    if (pTVar6 != pTVar10) {
      pp_Var8 = local_70._vptr_custom_op + (lVar9 + -1) * 3;
      lVar11 = 0;
      uVar7 = 0;
      do {
        *(_func_int **)((long)&pTVar12->SA + lVar11) = pp_Var8[2];
        p_Var5 = pp_Var8[1];
        puVar2 = (undefined8 *)((long)&pTVar12->B1 + lVar11);
        *puVar2 = *pp_Var8;
        puVar2[1] = p_Var5;
        uVar7 = uVar7 + 1;
        pTVar12 = (__return_storage_ptr__->
                  super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        pTVar10 = (__return_storage_ptr__->
                  super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
        lVar11 = lVar11 + 0x18;
        pp_Var8 = pp_Var8 + lVar9 * 3;
      } while (uVar7 < (ulong)(((long)pTVar10 - (long)pTVar12 >> 3) * -0x5555555555555555));
    }
  }
  else {
    pTVar10 = (__return_storage_ptr__->
              super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>).
              _M_impl.super__Vector_impl_data._M_finish;
    pTVar12 = (__return_storage_ptr__->
              super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>).
              _M_impl.super__Vector_impl_data._M_start;
  }
  lVar9 = ((long)pTVar10 - (long)pTVar12 >> 3) * -0x5555555555555555;
  if (lVar9 - (lVar14 + -1) != 0) {
    std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::resize
              (__return_storage_ptr__,(long)(iVar3 + -1));
    pTVar12 = (__return_storage_ptr__->
              super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>).
              _M_impl.super__Vector_impl_data._M_start;
    lVar9 = ((long)(__return_storage_ptr__->
                   super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)pTVar12 >> 3) *
            -0x5555555555555555;
  }
  MPI_Bcast(pTVar12,lVar9,local_80,0,*(undefined8 *)(param_5 + 8));
  if (local_70._vptr_custom_op != (_func_int **)0x0) {
    operator_delete(local_70._vptr_custom_op);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<typename std::iterator_traits<_Iterator>::value_type>
sample_arbit_decomp(_Iterator begin, _Iterator end, _Compare comp, int s, const mxx::comm& comm, MPI_Datatype mpi_dt) {
    typedef typename std::iterator_traits<_Iterator>::value_type value_type;
    std::size_t local_size = std::distance(begin, end);

    // get total size n
    std::size_t total_size = mxx::allreduce(local_size, comm);

    // p = number of processes
    int p = comm.size();

    //  pick a total of s*p samples, thus locally pick ceil((local_size/n)*s*p)
    //  and at least one samples from each processor.
    //  this will result in at least s*p samples.
    std::size_t local_s;
    if (local_size == 0)
        local_s = 0;
    else
        local_s = std::max<std::size_t>(((local_size*s*p)+total_size-1)/total_size, 1);

    //. init samples
    std::vector<value_type> local_splitters;

    // pick local samples
    if (local_s > 0) {
        local_splitters.resize(local_s);
        _Iterator pos = begin;
        for (std::size_t i = 0; i < local_splitters.size(); ++i)
        {
            std::size_t bucket_size = local_size / (local_s+1) + (i < (local_size % (local_s+1)) ? 1 : 0);
            // pick last element of each bucket
            pos += (bucket_size-1);
            local_splitters[i] = *pos;
            ++pos;
        }
    }

    // 2. gather samples to `rank = 0`
    // - TODO: rather call sample sort
    //         recursively and implement a base case for samplesort which does
    //         gather to rank=0, local sort and redistribute
    std::vector<value_type> all_samples = mxx::gatherv(local_splitters, 0, comm);

    // sort and pick p-1 samples on master
    if (comm.rank() == 0) {
        // 3. local sort on master
        std::sort(all_samples.begin(), all_samples.end(), comp);

        // 4. pick p-1 splitters and broadcast them
        if (local_splitters.size() != (size_t) p-1)
        {
            local_splitters.resize(p-1);
        }
        // split into `p` pieces and choose the `p-1` splitting elements
        _Iterator pos = all_samples.begin();
        for (std::size_t i = 0; i < local_splitters.size(); ++i)
        {
            std::size_t bucket_size = (p*s) / p + (i < static_cast<std::size_t>((p*s) % p) ? 1 : 0);
            // pick last element of each bucket
            local_splitters[i] = *(pos + (bucket_size-1));
            pos += bucket_size;
        }
    }

    // size splitters for receiving
    if (local_splitters.size() != (size_t)p-1) {
        local_splitters.resize(p-1);
    }

    // 4. broadcast and receive final splitters
    MPI_Bcast(&local_splitters[0], local_splitters.size(), mpi_dt, 0, comm);

    return local_splitters;
}